

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::detail::CmpHelperEqRange<int_const*,int_const*>
          (AssertionResult *__return_storage_ptr__,detail *this,char *expected_expr,
          char *actual_expr,int *b1,int *e1,int *b2,int *e2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *local_a0;
  AssertionResult local_98;
  undefined4 local_70;
  undefined1 local_60 [8];
  AssertionResult ar;
  int *b2_local;
  int *e1_local;
  int *b1_local;
  char *actual_expr_local;
  char *expected_expr_local;
  
  ar._32_8_ = e1;
  b1_local = (int *)expected_expr;
  actual_expr_local = (char *)this;
  expected_expr_local = (char *)__return_storage_ptr__;
  CmpHelperEqIterator<int_const*,int_const*>
            ((AssertionResult *)local_60,(iuutil *)actual_expr,b1,e1,b2,e1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_98,(char (*) [18])"error: Expected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&actual_expr_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [5])" == ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&b1_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])" \n  Actual:");
    local_a0 = iutest::GetAssertionResultMessage((AssertionResult *)local_60);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_a0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    iutest::AssertionResult::~AssertionResult(&local_98);
  }
  local_70 = 1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqRange(const char* expected_expr, const char* actual_expr
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperEqIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " == " << actual_expr
            << " \n  Actual:" << GetAssertionResultMessage(ar);
    }
}